

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O3

void duckdb::Node15Leaf::InsertByte(ART *art,Node *node,uint8_t byte)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  type paVar3;
  iterator iVar4;
  pointer this;
  data_ptr_t pdVar5;
  long lVar6;
  Node node15;
  IndexPointer local_30;
  
  uVar1 = (node->super_IndexPointer).data;
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar3->_M_elems[7].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_30.data = uVar1 & 0xffffffff;
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var2._M_head_impl)->buffers)._M_h,&local_30.data);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this,true);
  lVar6 = (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  if (pdVar5[(_Var2._M_head_impl)->bitmask_offset + lVar6] == '\x0f') {
    local_30.data = (node->super_IndexPointer).data;
    Node256Leaf::GrowNode15Leaf(art,node,(Node *)&local_30);
    Node256Leaf::InsertByte(art,node,byte);
  }
  else {
    BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::InsertByteInternal
              ((BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *)
               (pdVar5 + (_Var2._M_head_impl)->bitmask_offset + lVar6),byte);
  }
  return;
}

Assistant:

void Node15Leaf::InsertByte(ART &art, Node &node, const uint8_t byte) {
	// The node is full. Grow to Node256Leaf.
	auto &n15 = Node::Ref<Node15Leaf>(art, node, NODE_15_LEAF);
	if (n15.count == CAPACITY) {
		auto node15 = node;
		Node256Leaf::GrowNode15Leaf(art, node, node15);
		Node256Leaf::InsertByte(art, node, byte);
		return;
	}

	InsertByteInternal(n15, byte);
}